

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O3

LY_ERR lys_compile_unres_leafref
                 (lysc_ctx *ctx,lysc_node *node,lysc_type_leafref *lref,lysp_module *param_4)

{
  uint32_t *puVar1;
  lysc_node *plVar2;
  lysc_node *plVar3;
  uint16_t flags1;
  LY_ERR LVar4;
  LY_ERR LVar5;
  ly_path *in_RAX;
  long lVar6;
  size_t sVar7;
  char *pcVar8;
  ly_ctx *plVar9;
  char *pcVar10;
  ly_path *p;
  
  if ((node->nodetype & 0xc) == 0) {
    __assert_fail("node->nodetype & (LYS_LEAF | LYS_LEAFLIST)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                  ,0x357,
                  "LY_ERR lys_compile_unres_leafref(struct lysc_ctx *, const struct lysc_node *, struct lysc_type_leafref *, const struct lysp_module *)"
                 );
  }
  LVar4 = LY_SUCCESS;
  if ((lref->realtype == (lysc_type *)0x0) &&
     (p = in_RAX,
     LVar4 = ly_path_compile_leafref
                       (ctx->ctx,node,ctx->ext,lref->path,((node->flags >> 0xd & 1) != 0) + 1,0x20,
                        LY_VALUE_SCHEMA_RESOLVED,lref->prefixes,&p), LVar4 == LY_SUCCESS)) {
    if (p == (ly_path *)0x0) {
      lVar6 = -1;
    }
    else {
      lVar6 = (long)&p[-1].predicates[-1].field_1.position + 0x2f;
    }
    plVar2 = p[lVar6].node;
    ly_path_free(p);
    if ((plVar2->nodetype & 0xc) == 0) {
      plVar9 = ctx->ctx;
      pcVar10 = lref->path->expr;
      pcVar8 = lys_nodetype2str(plVar2->nodetype);
      ly_vlog(plVar9,(char *)0x0,LYVE_REFERENCE,
              "Invalid leafref path \"%s\" - target node is %s instead of leaf or leaf-list.",
              pcVar10,pcVar8);
      LVar4 = LY_EVALID;
    }
    else {
      ctx->path[0] = '\0';
      lysc_path(node,LYSC_PATH_LOG,ctx->path,0xfee);
      sVar7 = strlen(ctx->path);
      ctx->path_len = (uint32_t)sVar7;
      flags1 = 4;
      if (node->module == param_4->mod) {
        flags1 = node->flags;
      }
      LVar5 = lysc_check_status(ctx,flags1,param_4->mod,node->name,plVar2->flags,plVar2->module,
                                plVar2->name);
      LVar4 = LY_EVALID;
      if (LVar5 == LY_SUCCESS) {
        ctx->path_len = 1;
        ctx->path[1] = '\0';
        if (((lref->require_instance == '\0') || ((node->flags & 1) == 0)) ||
           ((plVar2->flags & 2) == 0)) {
          plVar2 = plVar2[1].parent;
          for (plVar3 = plVar2;
              (plVar3 != (lysc_node *)0x0 && (*(LY_DATA_TYPE *)&plVar3->next == LY_TYPE_LEAFREF));
              plVar3 = (lysc_node *)plVar3->dsc) {
            if (plVar3 == (lysc_node *)lref) {
              plVar9 = ctx->ctx;
              pcVar10 = lref->path->expr;
              pcVar8 = "Invalid leafref path \"%s\" - circular chain of leafrefs detected.";
              goto LAB_00143ca8;
            }
          }
          lref->realtype = (lysc_type *)plVar2;
          puVar1 = (uint32_t *)((long)&plVar2->next + 4);
          *puVar1 = *puVar1 + 1;
          LVar4 = LY_SUCCESS;
        }
        else {
          plVar9 = ctx->ctx;
          pcVar10 = lref->path->expr;
          pcVar8 = 
          "Invalid leafref path \"%s\" - target is supposed to represent configuration data (as the leafref does), but it does not."
          ;
LAB_00143ca8:
          ly_vlog(plVar9,(char *)0x0,LYVE_REFERENCE,pcVar8,pcVar10);
        }
      }
    }
  }
  return LVar4;
}

Assistant:

static LY_ERR
lys_compile_unres_leafref(struct lysc_ctx *ctx, const struct lysc_node *node, struct lysc_type_leafref *lref,
        const struct lysp_module *local_mod)
{
    const struct lysc_node *target = NULL;
    struct ly_path *p;
    struct lysc_type *type;
    uint16_t flg;

    assert(node->nodetype & (LYS_LEAF | LYS_LEAFLIST));

    if (lref->realtype) {
        /* already resolved, may happen (shared union typedef with a leafref) */
        return LY_SUCCESS;
    }

    /* try to find the target, current module is that of the context node (RFC 7950 6.4.1 second bullet) */
    LY_CHECK_RET(ly_path_compile_leafref(ctx->ctx, node, ctx->ext, lref->path,
            (node->flags & LYS_IS_OUTPUT) ? LY_PATH_OPER_OUTPUT : LY_PATH_OPER_INPUT, LY_PATH_TARGET_MANY,
            LY_VALUE_SCHEMA_RESOLVED, lref->prefixes, &p));

    /* get the target node */
    target = p[LY_ARRAY_COUNT(p) - 1].node;
    ly_path_free(p);

    if (!(target->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
        LOGVAL(ctx->ctx, LYVE_REFERENCE, "Invalid leafref path \"%s\" - target node is %s instead of leaf or leaf-list.",
                lref->path->expr, lys_nodetype2str(target->nodetype));
        return LY_EVALID;
    }

    /* check status */
    ctx->path[0] = '\0';
    lysc_path(node, LYSC_PATH_LOG, ctx->path, LYSC_CTX_BUFSIZE);
    ctx->path_len = strlen(ctx->path);
    if (node->module == local_mod->mod) {
        /* use flags of the context node since the definition is local */
        flg = node->flags;
    } else {
        /* definition is foreign (deviation), always current */
        flg = LYS_STATUS_CURR;
    }
    if (lysc_check_status(ctx, flg, local_mod->mod, node->name, target->flags, target->module, target->name)) {
        return LY_EVALID;
    }
    ctx->path_len = 1;
    ctx->path[1] = '\0';

    /* check config */
    if (lref->require_instance) {
        if ((node->flags & LYS_CONFIG_W) && (target->flags & LYS_CONFIG_R)) {
            LOGVAL(ctx->ctx, LYVE_REFERENCE, "Invalid leafref path \"%s\" - target is supposed"
                    " to represent configuration data (as the leafref does), but it does not.", lref->path->expr);
            return LY_EVALID;
        }
    }

    /* check for circular chain of leafrefs */
    for (type = ((struct lysc_node_leaf *)target)->type;
            type && (type->basetype == LY_TYPE_LEAFREF);
            type = ((struct lysc_type_leafref *)type)->realtype) {
        if (type == (struct lysc_type *)lref) {
            /* circular chain detected */
            LOGVAL(ctx->ctx, LYVE_REFERENCE, "Invalid leafref path \"%s\" - circular chain of leafrefs detected.",
                    lref->path->expr);
            return LY_EVALID;
        }
    }

    /* store the type */
    lref->realtype = ((struct lysc_node_leaf *)target)->type;
    ++lref->realtype->refcount;
    return LY_SUCCESS;
}